

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_OnChangedTextureID(ImDrawList *this)

{
  ImVec4 IVar1;
  uint uVar2;
  uint uVar3;
  ImTextureID pvVar4;
  ImDrawCmd *__src;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ImDrawCmd *pIVar8;
  int iVar9;
  int iVar10;
  undefined1 in_ZMM1 [64];
  
  pIVar8 = (this->CmdBuffer).Data;
  iVar7 = (this->CmdBuffer).Size;
  if ((pIVar8[(long)iVar7 + -1].ElemCount != 0) &&
     (pIVar8[(long)iVar7 + -1].TextureId != (this->_CmdHeader).TextureId)) {
    IVar1 = (this->_CmdHeader).ClipRect;
    auVar5 = vunpckhpd_avx((undefined1  [16])IVar1,ZEXT816(0) << 0x40);
    auVar5 = vcmpps_avx((undefined1  [16])IVar1,auVar5,2);
    auVar6 = vshufps_avx(auVar5,auVar5,0x50);
    auVar5 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    if (((auVar5 & ~auVar6) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar5 & ~auVar6,0xf)) {
      pvVar4 = (this->_CmdHeader).TextureId;
      uVar2 = (this->_CmdHeader).VtxOffset;
      uVar3 = (this->IdxBuffer).Size;
      iVar7 = (this->CmdBuffer).Size;
      if (iVar7 == (this->CmdBuffer).Capacity) {
        if (iVar7 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar7 / 2 + iVar7;
        }
        iVar10 = iVar7 + 1;
        if (iVar7 + 1 < iVar9) {
          iVar10 = iVar9;
        }
        pIVar8 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar10 * 0x38);
        __src = (this->CmdBuffer).Data;
        if (__src != (ImDrawCmd *)0x0) {
          memcpy(pIVar8,__src,(long)(this->CmdBuffer).Size * 0x38);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = pIVar8;
        (this->CmdBuffer).Capacity = iVar10;
        iVar7 = (this->CmdBuffer).Size;
      }
      else {
        pIVar8 = (this->CmdBuffer).Data;
      }
      pIVar8[iVar7].ClipRect = IVar1;
      pIVar8[iVar7].TextureId = pvVar4;
      pIVar8[iVar7].VtxOffset = uVar2;
      pIVar8[iVar7].IdxOffset = uVar3;
      *(undefined8 *)&pIVar8[iVar7].ElemCount = 0;
      *(ImDrawCallback *)(&pIVar8[iVar7].ElemCount + 2) = (ImDrawCallback)0x0;
      pIVar8[iVar7].UserCallbackData = (void *)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1c1,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar8[(long)iVar7 + -1].UserCallback != (ImDrawCallback)0x0) {
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x205,"void ImDrawList::_OnChangedTextureID()");
  }
  if ((((1 < iVar7) && (pIVar8[(long)iVar7 + -1].ElemCount == 0)) &&
      (auVar5 = vpor_avx((undefined1  [16])(this->_CmdHeader).ClipRect ^
                         (undefined1  [16])pIVar8[(long)iVar7 + -2].ClipRect,
                         *(undefined1 (*) [16])&(this->_CmdHeader).ClipRect.w ^
                         *(undefined1 (*) [16])&pIVar8[(long)iVar7 + -2].ClipRect.w),
      auVar5 == (undefined1  [16])0x0)) &&
     (pIVar8[(long)iVar7 + -2].UserCallback == (ImDrawCallback)0x0)) {
    (this->CmdBuffer).Size = iVar7 + -1;
    return;
  }
  pIVar8[(long)iVar7 + -1].TextureId = (this->_CmdHeader).TextureId;
  return;
}

Assistant:

void ImDrawList::_OnChangedTextureID()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != _CmdHeader.TextureId)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->TextureId = _CmdHeader.TextureId;
}